

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::HasNonBuiltInCallee(FunctionBody *this)

{
  ushort uVar1;
  code *pcVar2;
  ProfileId PVar3;
  bool bVar4;
  undefined4 *puVar5;
  ProfileId callSiteId;
  DynamicProfileInfo *this_00;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  PVar3 = 0;
  do {
    callSiteId = PVar3;
    uVar1 = this->profiledCallSiteCount;
    if (uVar1 <= callSiteId) break;
    this_00 = (this->dynamicProfileInfo).ptr;
    if (this_00 == (DynamicProfileInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1e9d,"(HasDynamicProfileInfo())","HasDynamicProfileInfo()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      this_00 = (this->dynamicProfileInfo).ptr;
    }
    bVar4 = DynamicProfileInfo::MayHaveNonBuiltinCallee(this_00,callSiteId);
    PVar3 = callSiteId + 1;
  } while (!bVar4);
  return callSiteId < uVar1;
}

Assistant:

bool FunctionBody::HasNonBuiltInCallee()
    {
        for (ProfileId i = 0; i < profiledCallSiteCount; i++)
        {
            Assert(HasDynamicProfileInfo());
            if (dynamicProfileInfo->MayHaveNonBuiltinCallee(i))
            {
                return true;
            }
        }
        return false;
    }